

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

size_t __thiscall Graph::reachableInPath(Graph *this,pathType *path,size_t startIndex,int speed)

{
  int iVar1;
  pointer ppEVar2;
  Edge *pEVar3;
  int iVar4;
  ulong uVar5;
  
  if (0 < speed) {
    ppEVar2 = (path->super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar5 = ((long)(path->super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3) - 1;
    if (uVar5 < startIndex) {
      uVar5 = startIndex;
    }
    do {
      if (uVar5 == startIndex) {
        return uVar5;
      }
      pEVar3 = ppEVar2[startIndex];
      iVar1 = pEVar3->maxSpeed;
      iVar4 = speed;
      if (iVar1 < speed) {
        iVar4 = iVar1;
      }
      startIndex = startIndex + 1;
      iVar1 = pEVar3->length;
      speed = iVar4 - iVar1;
    } while (speed != 0 && iVar1 <= iVar4);
  }
  return startIndex;
}

Assistant:

size_t Graph::reachableInPath(const pathType& path, size_t startIndex, int speed) {
  while(speed > 0 && startIndex < path.size()-1) {
    speed = std::min(speed, path[startIndex]->maxSpeed);
    speed -= path[startIndex++]->length;
  }
  return startIndex;
}